

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O3

void InfoCallback(SSL *ssl,int type,int value)

{
  if (type == 0x2001) {
    InfoCallback();
  }
  else if (type == 0x20) {
    InfoCallback();
  }
  else if (type == 0x10) {
    InfoCallback();
  }
  return;
}

Assistant:

static void InfoCallback(const SSL *ssl, int type, int value) {
  switch (type) {
    case SSL_CB_HANDSHAKE_START:
      fprintf(stderr, "Handshake started.\n");
      break;
    case SSL_CB_HANDSHAKE_DONE:
      fprintf(stderr, "Handshake done.\n");
      break;
    case SSL_CB_CONNECT_LOOP:
      fprintf(stderr, "Handshake progress: %s\n", SSL_state_string_long(ssl));
      break;
  }
}